

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O2

int wally_wif_is_uncompressed(char *wif,size_t *written)

{
  int iVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  uchar buf [38];
  
  bVar2 = written == (size_t *)0x0 || wif == (char *)0x0;
  if (bVar2) {
    iVar1 = -2;
  }
  else {
    iVar1 = is_uncompressed(wif,buf,(size_t)written,(size_t *)CONCAT71(in_register_00000009,bVar2));
    wally_clear(buf,0x26);
  }
  return iVar1;
}

Assistant:

int wally_wif_is_uncompressed(const char *wif,
                              size_t *written)
{
    int ret;
    unsigned char buf[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN];

    if (!wif || !written)
        return WALLY_EINVAL;

    ret = is_uncompressed(wif, buf, sizeof(buf), written);

    wally_clear(buf, sizeof(buf));
    return ret;
}